

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcontext_p.h
# Opt level: O0

QOpenGLFunctionsPrivateEx * __thiscall
QOpenGLMultiGroupSharedResource::value<QOpenGLFunctionsPrivateEx>
          (QHash<QAbstractFileIconProvider::IconType,_QIcon> *this,QOpenGLContext *context)

{
  long lVar1;
  QOpenGLFunctionsPrivateEx *this_00;
  QOpenGLSharedResource *in_RSI;
  QOpenGLContext *in_RDI;
  long in_FS_OFFSET;
  QOpenGLFunctionsPrivateEx *resource;
  QOpenGLContextGroup *group;
  QMutexLocker<QRecursiveMutex> locker;
  QRecursiveMutex *in_stack_ffffffffffffff98;
  QOpenGLFunctionsPrivateEx *in_stack_ffffffffffffffa0;
  QHash<QOpenGLMultiGroupSharedResource_*,_QOpenGLSharedResource_*> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QOpenGLContext::shareGroup((QOpenGLContext *)in_stack_ffffffffffffffa0);
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  QOpenGLContextGroup::d_func((QOpenGLContextGroup *)0x90f41e);
  this_00 = (QOpenGLFunctionsPrivateEx *)
            QHash<QOpenGLMultiGroupSharedResource_*,_QOpenGLSharedResource_*>::value
                      (in_stack_ffffffffffffffa8,
                       (QOpenGLMultiGroupSharedResource **)in_stack_ffffffffffffffa0,
                       (QOpenGLSharedResource **)in_stack_ffffffffffffff98);
  if (this_00 == (QOpenGLFunctionsPrivateEx *)0x0) {
    this_00 = (QOpenGLFunctionsPrivateEx *)operator_new(0xb78);
    QOpenGLFunctionsPrivateEx::QOpenGLFunctionsPrivateEx
              (in_stack_ffffffffffffffa0,(QOpenGLContext *)in_stack_ffffffffffffff98);
    insert((QOpenGLMultiGroupSharedResource *)this_00,in_RDI,in_RSI);
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

T *value(QOpenGLContext *context) {
        QOpenGLContextGroup *group = context->shareGroup();
        // Have to use our own mutex here, not the group's, since
        // m_groups has to be protected too against any concurrent access.
        QMutexLocker locker(&m_mutex);
        T *resource = static_cast<T *>(group->d_func()->m_resources.value(this, nullptr));
        if (!resource) {
            resource = new T(context);
            insert(context, resource);
        }
        return resource;
    }